

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O0

TransactionController * __thiscall
cfd::api::TransactionApi::AddSign
          (TransactionApi *this,string *hex,Txid *txid,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
          bool is_witness,bool clear_stack)

{
  _func_TransactionController_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_RCX;
  function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDX;
  TransactionController *in_RDI;
  undefined1 in_stack_00000276;
  undefined1 in_stack_00000277;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_00000278;
  uint32_t in_stack_00000284;
  Txid *in_stack_00000288;
  string *in_stack_00000290;
  function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_00000298;
  
  std::function<cfd::TransactionController(std::__cxx11::string_const&)>::
  function<cfd::TransactionController(&)(std::__cxx11::string_const&),void>(in_RDX,in_RCX);
  TransactionApiBase::AddSign<cfd::TransactionController>
            (in_stack_00000298,in_stack_00000290,in_stack_00000288,in_stack_00000284,
             in_stack_00000278,(bool)in_stack_00000277,(bool)in_stack_00000276);
  std::
  function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x3ef40f);
  return in_RDI;
}

Assistant:

TransactionController TransactionApi::AddSign(
    const std::string& hex, const Txid& txid, const uint32_t vout,
    const std::vector<SignParameter>& sign_params, bool is_witness,
    bool clear_stack) const {
  return TransactionApiBase::AddSign<TransactionController>(
      cfd::api::CreateController, hex, txid, vout, sign_params, is_witness,
      clear_stack);
}